

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_memory.cpp
# Opt level: O0

void pageProtect(void *ptr,size_t bytes,int rules)

{
  int iVar1;
  runtime_error *this;
  int in_EDX;
  size_t in_RSI;
  void *in_RDI;
  
  iVar1 = mprotect(in_RDI,in_RSI,in_EDX);
  if (iVar1 == -1) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"mprotect failed");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

static inline void pageProtect(void* ptr, std::size_t bytes, int rules) {
#if defined(_WIN32) || defined(__CYGWIN__)
	DWORD oldp;
	if (!VirtualProtect(ptr, bytes, (DWORD)rules, &oldp)) {
		throw std::runtime_error(getErrorMessage("VirtualProtect"));
	}
#else
	if (-1 == mprotect(ptr, bytes, rules))
		throw std::runtime_error("mprotect failed");
#endif
}